

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void bigval_mul_mod_p(bigval *r,bigval *a,bigval *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  BignumDblInt ADC_temp_3;
  BignumDblInt ADC_temp_2;
  BignumDblInt ADC_temp_1;
  BignumDblInt ADC_temp;
  BignumDblInt MUL_temp_9;
  BignumDblInt MUL_temp_8;
  BignumDblInt MUL_temp_7;
  BignumDblInt MUL_temp_6;
  BignumDblInt MUL_temp_5;
  BignumDblInt MUL_temp_4;
  BignumDblInt MUL_temp_3;
  BignumDblInt MUL_temp_2;
  BignumDblInt MUL_temp_1;
  BignumDblInt MUL_temp;
  BignumCarry carry;
  BignumInt v43;
  BignumInt v42;
  BignumInt v41;
  BignumInt v40;
  BignumInt v39;
  BignumInt v38;
  BignumInt v36;
  BignumInt v34;
  BignumInt v33;
  BignumInt v32;
  BignumInt v31;
  BignumInt v30;
  BignumInt v29;
  BignumInt v28;
  BignumInt v27;
  BignumInt v26;
  BignumInt v25;
  BignumInt v24;
  BignumInt v22;
  BignumInt v21;
  BignumInt v20;
  BignumInt v19;
  BignumInt v18;
  BignumInt v17;
  BignumInt v16;
  BignumInt v15;
  BignumInt v14;
  BignumInt v13;
  BignumInt v12;
  BignumInt v11;
  BignumInt v10;
  BignumInt v9;
  BignumInt v8;
  BignumInt v7;
  BignumInt v6;
  BignumInt v5;
  BignumInt v4;
  BignumInt v3;
  BignumInt v2;
  BignumInt v1;
  BignumInt v0;
  bigval *b_local;
  bigval *a_local;
  bigval *r_local;
  
  uVar24 = a->w[0];
  uVar27 = a->w[1];
  uVar30 = a->w[2];
  uVar28 = b->w[0];
  uVar29 = b->w[1];
  uVar36 = b->w[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar24;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar28;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SUB168(auVar1 * auVar9,8);
  uVar23 = SUB168(auVar1 * auVar9,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar24;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar29;
  auVar19 = auVar2 * auVar10 + auVar19;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar19._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar19._8_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar24;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar36;
  auVar20 = auVar3 * auVar11 + auVar20;
  uVar31 = auVar20._0_8_;
  uVar24 = auVar20._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar27;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar28;
  auVar21 = auVar4 * auVar12 + auVar21;
  uVar32 = auVar21._0_8_;
  uVar25 = auVar21._8_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar27;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar29;
  uVar26 = SUB168(auVar5 * auVar13,0);
  uVar33 = uVar26 + uVar31;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar33 + uVar25;
  uVar25 = SUB168(auVar5 * auVar13,8) + (ulong)CARRY8(uVar26,uVar31) + (ulong)CARRY8(uVar33,uVar25);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar27;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar36;
  uVar27 = SUB168(auVar6 * auVar14,0);
  uVar26 = uVar27 + uVar24;
  uVar31 = uVar26 + uVar25;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar30;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar28;
  auVar22 = auVar7 * auVar15 + auVar22;
  uVar33 = auVar22._0_8_;
  uVar28 = auVar22._8_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar30;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar29;
  uVar29 = SUB168(auVar8 * auVar16,0);
  uVar34 = uVar29 + uVar31;
  uVar35 = uVar34 + uVar28;
  uVar30 = uVar30 * uVar36 +
           SUB168(auVar6 * auVar14,8) + (ulong)CARRY8(uVar27,uVar24) + (ulong)CARRY8(uVar26,uVar25)
           + SUB168(auVar8 * auVar16,8) + (ulong)CARRY8(uVar29,uVar31) +
             (ulong)CARRY8(uVar34,uVar28);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar33 >> 2 | uVar35 << 0x3e;
  uVar31 = SUB168(ZEXT816(5) * auVar17,8);
  uVar24 = SUB168(ZEXT816(5) * auVar17,0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar35 >> 2 | uVar30 << 0x3e;
  uVar28 = SUB168(ZEXT816(5) * auVar18,0);
  uVar36 = uVar28 + uVar31;
  uVar29 = (uVar30 >> 4) * 0x19;
  uVar25 = uVar23 + uVar24;
  uVar24 = (ulong)CARRY8(uVar23,uVar24);
  uVar23 = uVar32 + uVar36;
  uVar26 = uVar23 + uVar24;
  uVar27 = (ulong)CARRY8(uVar25,uVar29);
  r->w[0] = uVar25 + uVar29;
  r->w[1] = uVar26 + uVar27;
  r->w[2] = (uVar33 & 3) +
            (uVar30 >> 2 & 3) * 5 + SUB168(ZEXT816(5) * auVar18,8) + (ulong)CARRY8(uVar28,uVar31) +
            (ulong)CARRY8(uVar32,uVar36) + (ulong)CARRY8(uVar23,uVar24) +
            (ulong)CARRY8(uVar26,uVar27);
  return;
}

Assistant:

static void bigval_mul_mod_p(bigval *r, const bigval *a, const bigval *b)
{
    BignumInt v0, v1, v2, v3, v4, v5, v6, v7, v8, v9, v10, v11, v12, v13, v14;
    BignumInt v15, v16, v17, v18, v19, v20, v21, v22, v24, v25, v26, v27, v28;
    BignumInt v29, v30, v31, v32, v33, v34, v36, v38, v39, v40, v41, v42, v43;
    BignumCarry carry;

    v0 = a->w[0];
    v1 = a->w[1];
    v2 = a->w[2];
    v3 = b->w[0];
    v4 = b->w[1];
    v5 = b->w[2];
    BignumMUL(v7, v6, v0, v3);
    BignumMULADD(v9, v8, v0, v4, v7);
    BignumMULADD(v11, v10, v0, v5, v9);
    BignumMULADD(v13, v12, v1, v3, v8);
    BignumMULADD2(v15, v14, v1, v4, v10, v13);
    BignumMULADD2(v17, v16, v1, v5, v11, v15);
    BignumMULADD(v19, v18, v2, v3, v14);
    BignumMULADD2(v21, v20, v2, v4, v16, v19);
    v22 = v2 * v5 + v17 + v21;
    v24 = (v18) & ((((BignumInt)1) << 2)-1);
    v25 = ((v18) >> 2) | ((v20) << 62);
    v26 = ((v20) >> 2) | ((v22) << 62);
    v27 = (v22) >> 2;
    v28 = (v27) & ((((BignumInt)1) << 2)-1);
    v29 = (v22) >> 4;
    BignumMUL(v31, v30, 5, v25);
    BignumMULADD(v33, v32, 5, v26, v31);
    v34 = 5 * v28 + v33;
    v36 = 25 * v29;
    BignumADC(v38, carry, v6, v30, 0);
    BignumADC(v39, carry, v12, v32, carry);
    v40 = v24 + v34 + carry;
    BignumADC(v41, carry, v38, v36, 0);
    BignumADC(v42, carry, v39, 0, carry);
    v43 = v40 + 0 + carry;
    r->w[0] = v41;
    r->w[1] = v42;
    r->w[2] = v43;
}